

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall Parser::parse_statement(Parser *this,bool in_func)

{
  Type TVar1;
  Token *pTVar2;
  AbstractSyntaxNode *pAVar3;
  char *pcVar4;
  ostream *poVar5;
  parser_exception *ppVar6;
  bool bVar7;
  string local_378;
  int local_354;
  TokenPosition local_350;
  int local_334;
  string local_330;
  Type local_30c;
  Token local_308;
  int local_2ac [3];
  int local_2a0 [2];
  Token local_298;
  int local_23c [8];
  undefined1 local_219;
  string local_218;
  int local_1f4;
  TokenPosition local_1f0;
  int local_1d8 [11];
  int local_1ac;
  stringstream local_1a8 [8];
  stringstream buffer;
  ostream local_198 [380];
  int local_1c [2];
  byte local_11;
  Parser *pPStack_10;
  bool in_func_local;
  Parser *this_local;
  
  pAVar3 = this->current_;
  local_1c[1] = 0x28;
  local_1c[0] = 1;
  local_11 = in_func;
  pPStack_10 = this;
  pTVar2 = forward_token(this,local_1c);
  pAVar3 = AbstractSyntaxNode::add_child(pAVar3,(Type *)(local_1c + 1),pTVar2);
  this->current_ = pAVar3;
  std::__cxx11::stringstream::stringstream(local_1a8);
  bVar7 = false;
  if ((local_11 & 1) == 0) {
    local_1ac = 1;
    pTVar2 = forward_token(this,&local_1ac);
    TVar1 = Token::type(pTVar2);
    bVar7 = true;
    if (TVar1 != kIf) {
      local_1d8[6] = 1;
      pTVar2 = forward_token(this,local_1d8 + 6);
      TVar1 = Token::type(pTVar2);
      bVar7 = true;
      if (TVar1 != kWhile) {
        local_1d8[5] = 1;
        pTVar2 = forward_token(this,local_1d8 + 5);
        TVar1 = Token::type(pTVar2);
        bVar7 = true;
        if (TVar1 != kRead) {
          local_1d8[4] = 1;
          pTVar2 = forward_token(this,local_1d8 + 4);
          TVar1 = Token::type(pTVar2);
          bVar7 = true;
          if (TVar1 != kWrite) {
            local_1d8[3] = 1;
            pTVar2 = forward_token(this,local_1d8 + 3);
            TVar1 = Token::type(pTVar2);
            if (TVar1 == kIdentity) {
              local_1d8[2] = 2;
              pTVar2 = forward_token(this,local_1d8 + 2);
              TVar1 = Token::type(pTVar2);
              bVar7 = true;
              if (TVar1 == kLeftParen) goto LAB_001a8b46;
            }
            local_1d8[1] = 1;
            pTVar2 = forward_token(this,local_1d8 + 1);
            TVar1 = Token::type(pTVar2);
            bVar7 = TVar1 == kReturn;
          }
        }
      }
    }
  }
LAB_001a8b46:
  if (bVar7) {
    poVar5 = std::operator<<(local_198,"\"");
    local_1d8[0] = 1;
    pTVar2 = forward_token(this,local_1d8);
    pcVar4 = Token::type_name(pTVar2);
    poVar5 = std::operator<<(poVar5,pcVar4);
    std::operator<<(poVar5,anon_var_dwarf_5f91b);
    local_219 = 1;
    ppVar6 = (parser_exception *)__cxa_allocate_exception(0x40);
    local_1f4 = 1;
    pTVar2 = forward_token(this,&local_1f4);
    Token::position(&local_1f0,pTVar2);
    std::__cxx11::stringstream::str();
    parser_exception::parser_exception(ppVar6,&local_1f0,&local_218);
    local_219 = 0;
    __cxa_throw(ppVar6,&parser_exception::typeinfo,parser_exception::~parser_exception);
  }
  local_23c[7] = 1;
  pTVar2 = forward_token(this,local_23c + 7);
  TVar1 = Token::type(pTVar2);
  if (TVar1 == kIf) {
    parse_if_statement(this);
  }
  else {
    local_23c[6] = 1;
    pTVar2 = forward_token(this,local_23c + 6);
    TVar1 = Token::type(pTVar2);
    if (TVar1 == kWhile) {
      parse_while_statement(this);
    }
    else {
      local_23c[5] = 1;
      pTVar2 = forward_token(this,local_23c + 5);
      TVar1 = Token::type(pTVar2);
      if (TVar1 == kRead) {
        parse_read_statement(this);
      }
      else {
        local_23c[4] = 1;
        pTVar2 = forward_token(this,local_23c + 4);
        TVar1 = Token::type(pTVar2);
        if (TVar1 == kWrite) {
          parse_write_statement(this);
        }
        else {
          local_23c[3] = 1;
          pTVar2 = forward_token(this,local_23c + 3);
          TVar1 = Token::type(pTVar2);
          bVar7 = false;
          if (TVar1 == kIdentity) {
            local_23c[2] = 2;
            pTVar2 = forward_token(this,local_23c + 2);
            TVar1 = Token::type(pTVar2);
            bVar7 = TVar1 != kLeftParen;
          }
          if (bVar7) {
            parse_assign_statement(this);
          }
          else {
            local_23c[1] = 1;
            pTVar2 = forward_token(this,local_23c + 1);
            TVar1 = Token::type(pTVar2);
            bVar7 = false;
            if (TVar1 == kIdentity) {
              local_23c[0] = 2;
              pTVar2 = forward_token(this,local_23c);
              TVar1 = Token::type(pTVar2);
              bVar7 = TVar1 == kLeftParen;
            }
            if (bVar7) {
              parse_function_call(this);
              local_2a0[1] = 0x11;
              match(&local_298,this,(Type *)(local_2a0 + 1));
              Token::~Token(&local_298);
            }
            else {
              local_2a0[0] = 1;
              pTVar2 = forward_token(this,local_2a0);
              TVar1 = Token::type(pTVar2);
              if (TVar1 == kReturn) {
                parse_return_statement(this);
              }
              else {
                local_2ac[1] = 1;
                pTVar2 = forward_token(this,local_2ac + 1);
                local_2ac[2] = Token::type(pTVar2);
                bVar7 = is_declare_keyword(this,(Type *)(local_2ac + 2));
                if (bVar7) {
                  parse_declare_statement(this);
                }
                else {
                  local_2ac[0] = 1;
                  pTVar2 = forward_token(this,local_2ac);
                  TVar1 = Token::type(pTVar2);
                  if (TVar1 != kSemicolon) {
                    poVar5 = std::operator<<(local_198,anon_var_dwarf_5f8ef);
                    local_334 = 1;
                    pTVar2 = forward_token(this,&local_334);
                    Token::content_abi_cxx11_(&local_330,pTVar2);
                    poVar5 = std::operator<<(poVar5,(string *)&local_330);
                    std::operator<<(poVar5,anon_var_dwarf_5f931);
                    std::__cxx11::string::~string((string *)&local_330);
                    ppVar6 = (parser_exception *)__cxa_allocate_exception(0x40);
                    local_354 = 1;
                    pTVar2 = forward_token(this,&local_354);
                    Token::position(&local_350,pTVar2);
                    std::__cxx11::stringstream::str();
                    parser_exception::parser_exception(ppVar6,&local_350,&local_378);
                    __cxa_throw(ppVar6,&parser_exception::typeinfo,
                                parser_exception::~parser_exception);
                  }
                  local_30c = kSemicolon;
                  match(&local_308,this,&local_30c);
                  Token::~Token(&local_308);
                }
              }
            }
          }
        }
      }
    }
  }
  pAVar3 = AbstractSyntaxNode::parent(this->current_);
  this->current_ = pAVar3;
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return;
}

Assistant:

void Parser::parse_statement(bool in_func) {
    current_ = current_->add_child(Token::Type::kStatement, forward_token());
    std::stringstream buffer;

    if (!in_func && (forward_token().type() == Token::Type::kIf ||
                     forward_token().type() == Token::Type::kWhile ||
                     forward_token().type() == Token::Type::kRead ||
                     forward_token().type() == Token::Type::kWrite ||
                     (forward_token().type() == Token::Type::kIdentity && forward_token(2).type() == Token::Type::kLeftParen) ||
                     forward_token().type() == Token::Type::kReturn)) {
        buffer << "\"" << forward_token().type_name() << "\" 语句位于函数体外无效";
        throw parser_exception(forward_token().position(), buffer.str());
    }


    if (forward_token().type() == Token::Type::kIf) {
        parse_if_statement();
    } else if (forward_token().type() == Token::Type::kWhile) {
        parse_while_statement();
    } else if (forward_token().type() == Token::Type::kRead) {
        parse_read_statement();
    } else if (forward_token().type() == Token::Type::kWrite) {
        parse_write_statement();
    } else if (forward_token().type() == Token::Type::kIdentity && forward_token(2).type() != Token::Type::kLeftParen) {
        parse_assign_statement();
    } else if (forward_token().type() == Token::Type::kIdentity && forward_token(2).type() == Token::Type::kLeftParen) {
        parse_function_call();
        match(Token::Type::kSemicolon);
    } else if (forward_token().type() == Token::Type::kReturn) {
        parse_return_statement();
    } else if (is_declare_keyword(forward_token().type())) {
        parse_declare_statement();
    } else if (forward_token().type() == Token::Type::kSemicolon) {
        match(Token::Type::kSemicolon);
    } else {
        buffer << "无效的标识符 \"" << forward_token().content() << "\", 无法解析该语句, 请确认是否合法";
        throw parser_exception(forward_token().position(), buffer.str());
    }

    current_ = current_->parent();
}